

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void sensors_analytics::utils::ObjectNode::ValueNode::ToStr(ValueNode *node,string *buffer)

{
  char *pcVar1;
  string *buffer_local;
  ValueNode *node_local;
  
  switch(node->node_type_) {
  case NUMBER:
    DumpNumber((node->value_).number_value,buffer);
    break;
  case INT:
    DumpNumber((node->value_).int_value,buffer);
    break;
  case STRING:
    DumpString(&node->string_data_,buffer);
    break;
  case LIST:
    DumpList(&node->list_data_,buffer);
    break;
  case DATETIME:
    DumpDateTime(&(node->value_).int_value,(node->value_).date_time_value.milliseconds,buffer);
    break;
  case BOOL:
    pcVar1 = "false";
    if (((node->value_).bool_value & 1U) != 0) {
      pcVar1 = "true";
    }
    std::__cxx11::string::operator+=((string *)buffer,pcVar1);
    break;
  case OBJECT:
    DumpNode(&node->object_data_,buffer);
  }
  return;
}

Assistant:

void
utils::ObjectNode::ValueNode::ToStr(const utils::ObjectNode::ValueNode &node,
                                    string *buffer) {
  switch (node.node_type_) {
    case NUMBER:
      DumpNumber(node.value_.number_value, buffer);
      break;
    case INT:
      DumpNumber(node.value_.int_value, buffer);
      break;
    case STRING:
      DumpString(node.string_data_, buffer);
      break;
    case LIST:
      DumpList(node.list_data_, buffer);
      break;
    case BOOL:
      *buffer += (node.value_.bool_value ? "true" : "false");
      break;
    case OBJECT:
      DumpNode(node.object_data_, buffer);
      break;
    case DATETIME:
      DumpDateTime(node.value_.date_time_value.seconds,
                   node.value_.date_time_value.milliseconds, buffer);
      break;
    default:
      break;
  }
}